

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseBandwidth.cpp
# Opt level: O1

void __thiscall
tonk::ReceiverBandwidthControl::Initialize(ReceiverBandwidthControl *this,Dependencies *deps)

{
  Channel *pCVar1;
  undefined8 uVar2;
  TimeT TVar3;
  
  pCVar1 = deps->Logger;
  (this->Deps).TimeSync = deps->TimeSync;
  (this->Deps).Logger = pCVar1;
  (this->NextShape).AppBPS = 13000;
  (this->NextShape).FECRate = 0.01;
  this->ShouldAckFast = false;
  (this->RecentOWD).Samples[2].Value.Value = 0;
  (this->RecentOWD).Samples[2].Timestamp = 0;
  (this->RecentOWD).Samples[1].Value.Value = 0;
  (this->RecentOWD).Samples[1].Timestamp = 0;
  (this->RecentOWD).Samples[0].Value.Value = 0;
  (this->RecentOWD).Samples[0].Timestamp = 0;
  this->RecentOWD_WindowUsec = 100000;
  (this->MinOWD).Samples[2].Value.Value = 0;
  (this->MinOWD).Samples[2].Timestamp = 0;
  (this->MinOWD).Samples[1].Value.Value = 0;
  (this->MinOWD).Samples[1].Timestamp = 0;
  (this->MinOWD).Samples[0].Value.Value = 0;
  (this->MinOWD).Samples[0].Timestamp = 0;
  this->MinOWD_WindowUsec = 1000000;
  (this->RecentMaxBW).Samples[2].Value = 0;
  (this->RecentMaxBW).Samples[2].Timestamp = 0;
  uVar2 = *(undefined8 *)((this->RecentMaxBW).Samples + 2);
  TVar3 = (this->RecentMaxBW).Samples[2].Timestamp;
  *(undefined8 *)((this->RecentMaxBW).Samples + 1) = uVar2;
  (this->RecentMaxBW).Samples[1].Timestamp = TVar3;
  *(undefined8 *)(this->RecentMaxBW).Samples = uVar2;
  (this->RecentMaxBW).Samples[0].Timestamp = TVar3;
  this->InSlowStart = true;
  this->Momentum = 1;
  return;
}

Assistant:

void ReceiverBandwidthControl::Initialize(const Dependencies& deps)
{
    Deps = deps;

    NextShape.AppBPS = protocol::kBandwidthBurstTokenLimit;
    NextShape.FECRate = TONK_MIN_FEC_RATE;

    ShouldAckFast = false;

    RecentOWD.Reset();
    RecentOWD_WindowUsec = 100 * 1000;

    MinOWD.Reset();
    MinOWD_WindowUsec = 1000 * 1000;

    RecentMaxBW.Reset();

    InSlowStart = true;
    Momentum = 1;
}